

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastMultiplier(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vTemp,
                        Vec_Int_t *vRes,int fSigned)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  Gia_Man_t *pNew_00;
  int *piVar4;
  uint uVar5;
  undefined4 in_register_00000084;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int Carry;
  int *local_70;
  ulong local_68;
  int *local_60;
  int *local_58;
  Gia_Man_t *local_50;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  local_70 = (int *)CONCAT44(in_register_00000084,nArgB);
  Carry = fSigned;
  if ((nArgA < 1) || (nArgB < 1)) {
    __assert_fail("nArgA > 0 && nArgB > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x195,
                  "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (1 < (uint)fSigned) {
    __assert_fail("fSigned == 0 || fSigned == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x196,
                  "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  uVar5 = nArgB + nArgA;
  piVar4 = vRes->pArray;
  local_50 = pNew;
  if (vRes->nCap < (int)uVar5) {
    sVar7 = (ulong)uVar5 << 2;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar7);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar7);
    }
    vRes->pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00304595;
    vRes->nCap = uVar5;
  }
  local_58 = piVar4;
  memset(piVar4,0,(ulong)uVar5 << 2);
  vRes->nSize = uVar5;
  uVar5 = nArgA * 2;
  piVar4 = vTemp->pArray;
  local_40 = pArgA;
  local_38 = pArgB;
  if (vTemp->nCap < (int)uVar5) {
    sVar7 = (ulong)uVar5 << 2;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar7);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar7);
    }
    vTemp->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_00304595:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTemp->nCap = uVar5;
  }
  local_68 = 0;
  memset(piVar4,0,(ulong)uVar5 << 2);
  vTemp->nSize = uVar5;
  uVar3 = (ulong)(uint)nArgA;
  uVar9 = (ulong)local_70 & 0xffffffff;
  local_60 = piVar4;
  local_48 = uVar3;
  do {
    local_70 = local_58 + local_68;
    uVar1 = local_68 + 1;
    lVar8 = 0;
    do {
      piVar2 = (int *)((long)piVar4 + lVar8 + uVar3 * 4 + -4);
      piVar6 = piVar2;
      if (lVar8 == 0) {
        piVar6 = local_70;
      }
      Wlc_BlastFullAdderCtrl
                (local_50,*(int *)((long)local_40 + lVar8),local_38[local_68],piVar2[1],
                 *(int *)((long)piVar4 + lVar8),(int *)((long)piVar4 + lVar8),piVar6,
                 (uint)((uVar3 * 4 + -4 == lVar8) != (uVar1 == uVar9) && fSigned != 0));
      pNew_00 = local_50;
      piVar6 = local_58;
      piVar2 = local_60;
      lVar8 = lVar8 + 4;
    } while (uVar3 * 4 - lVar8 != 0);
    local_68 = uVar1;
  } while (uVar1 != uVar9);
  piVar4[uVar3 + (local_48 - 1)] = fSigned;
  lVar8 = local_48 << 2;
  lVar10 = 0;
  do {
    Wlc_BlastFullAdderCtrl
              (pNew_00,1,*(int *)((long)piVar2 + lVar10),*(int *)((long)piVar4 + lVar10 + uVar3 * 4)
               ,Carry,&Carry,(int *)((long)piVar6 + lVar10 + uVar9 * 4),0);
    lVar10 = lVar10 + 4;
  } while (lVar8 != lVar10);
  return;
}

Assistant:

void Wlc_BlastMultiplier( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vTemp, Vec_Int_t * vRes, int fSigned )
{
    int * pRes, * pArgC, * pArgS, a, b, Carry = fSigned;
    assert( nArgA > 0 && nArgB > 0 );
    assert( fSigned == 0 || fSigned == 1 );
    // prepare result
    Vec_IntFill( vRes, nArgA + nArgB, 0 );
    pRes = Vec_IntArray( vRes );
    // prepare intermediate storage
    Vec_IntFill( vTemp, 2 * nArgA, 0 );
    pArgC = Vec_IntArray( vTemp );
    pArgS = pArgC + nArgA;
    // create matrix
    for ( b = 0; b < nArgB; b++ )
        for ( a = 0; a < nArgA; a++ )
            Wlc_BlastFullAdderCtrl( pNew, pArgA[a], pArgB[b], pArgS[a], pArgC[a], 
                &pArgC[a], a ? &pArgS[a-1] : &pRes[b], fSigned && ((a+1 == nArgA) ^ (b+1 == nArgB)) );
    // final addition
    pArgS[nArgA-1] = fSigned;
    for ( a = 0; a < nArgA; a++ )
        Wlc_BlastFullAdderCtrl( pNew, 1, pArgC[a], pArgS[a], Carry, &Carry, &pRes[nArgB+a], 0 );
}